

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

skiwi_compiled_function_ptr skiwi::skiwi_compile(string *scheme_expression)

{
  repl_data *in_RCX;
  environment_map *in_RDX;
  fptr f;
  uint64_t size;
  fptr local_18;
  uint64_t local_10;
  
  local_18 = anon_unknown_1::compile(&local_10,scheme_expression,in_RDX,in_RCX);
  if (local_18 == (fptr)0x0) {
    local_18 = (skiwi_compiled_function_ptr)0x0;
  }
  else {
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&DAT_002b3920,(_func_unsigned_long_void_ptr_varargs **)&local_18,&local_10);
  }
  return local_18;
}

Assistant:

skiwi_compiled_function_ptr skiwi_compile(const std::string& scheme_expression)
  {
  using namespace SKIWI;
  uint64_t size;
  auto f = compile(size, scheme_expression, cd.env, cd.rd);
  if (f)
    {
#ifdef _SKIWI_FOR_ARM
    cd.compiled_bytecode.emplace_back(f, size);
#else
    cd.compiled_functions.emplace_back(f, size);
#endif
    }
  return (skiwi_compiled_function_ptr)f;
  }